

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error asmjit::v1_14::CodeHolder_evaluateExpression(CodeHolder *self,Expression *exp,uint64_t *out)

{
  long lVar1;
  Error EVar2;
  Expression *in_RDX;
  CodeHolder *in_RSI;
  uint64_t *b;
  uint64_t *a;
  uint64_t result;
  Error _err;
  Expression *nested;
  LabelEntry *le;
  uint64_t v;
  size_t i;
  uint64_t value [2];
  byte local_f8;
  ulong local_e8;
  ulong local_e0;
  ulong local_a8;
  ulong local_88;
  ulong local_80;
  ulong local_78 [2];
  uint64_t *in_stack_ffffffffffffff98;
  
  local_80 = 0;
  do {
    if (1 < local_80) {
      local_f8 = (byte)local_78[1];
      switch((in_RSI->_environment)._arch) {
      case kUnknown:
        local_a8 = local_78[0] + local_78[1];
        break;
      case k32BitMask:
        local_a8 = local_78[0] - local_78[1];
        break;
      case kHost:
        local_a8 = local_78[0] * local_78[1];
        break;
      case kRISCV32:
        if (local_78[1] < 0x40) {
          local_e0 = local_78[0] << (local_f8 & 0x3f);
        }
        else {
          local_e0 = 0;
        }
        local_a8 = local_e0;
        break;
      case kRISCV64:
        if (local_78[1] < 0x40) {
          local_e8 = local_78[0] >> (local_f8 & 0x3f);
        }
        else {
          local_e8 = 0;
        }
        local_a8 = local_e8;
        break;
      case kARM:
        if (0x3f < local_78[1]) {
          local_f8 = 0x3f;
        }
        local_a8 = (long)local_78[0] >> (local_f8 & 0x3f);
        break;
      default:
        EVar2 = DebugUtils::errored(3);
        return EVar2;
      }
      in_RDX->opType = (undefined1)local_a8;
      in_RDX->valueType[0] = local_a8._1_1_;
      in_RDX->valueType[1] = local_a8._2_1_;
      in_RDX->reserved[0] = local_a8._3_1_;
      in_RDX->reserved[1] = local_a8._4_1_;
      in_RDX->reserved[2] = local_a8._5_1_;
      in_RDX->reserved[3] = local_a8._6_1_;
      in_RDX->reserved[4] = local_a8._7_1_;
      return 0;
    }
    switch((&(in_RSI->_environment)._subArch)[local_80]) {
    case kHost:
      local_88 = 0;
      break;
    case 1:
      local_88 = *(ulong *)(&in_RSI->_cpuFeatures + local_80 * 8);
      break;
    case 2:
      lVar1 = *(long *)(&in_RSI->_cpuFeatures + local_80 * 8);
      if (*(long *)(lVar1 + 0x20) == 0) {
        EVar2 = DebugUtils::errored(0x43);
        return EVar2;
      }
      local_88 = *(long *)(*(long *)(lVar1 + 0x20) + 0x10) + *(long *)(lVar1 + 0x18);
      break;
    case 3:
      EVar2 = CodeHolder_evaluateExpression(in_RSI,in_RDX,in_stack_ffffffffffffff98);
      if (EVar2 != 0) {
        return EVar2;
      }
      break;
    default:
      EVar2 = DebugUtils::errored(3);
      return EVar2;
    }
    local_78[local_80] = local_88;
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

static Error CodeHolder_evaluateExpression(CodeHolder* self, Expression* exp, uint64_t* out) noexcept {
  uint64_t value[2];
  for (size_t i = 0; i < 2; i++) {
    uint64_t v;
    switch (exp->valueType[i]) {
      case ExpressionValueType::kNone: {
        v = 0;
        break;
      }

      case ExpressionValueType::kConstant: {
        v = exp->value[i].constant;
        break;
      }

      case ExpressionValueType::kLabel: {
        LabelEntry* le = exp->value[i].label;
        if (!le->isBound())
          return DebugUtils::errored(kErrorExpressionLabelNotBound);
        v = le->section()->offset() + le->offset();
        break;
      }

      case ExpressionValueType::kExpression: {
        Expression* nested = exp->value[i].expression;
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(self, nested, &v));
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    value[i] = v;
  }

  uint64_t result;
  uint64_t& a = value[0];
  uint64_t& b = value[1];

  switch (exp->opType) {
    case ExpressionOpType::kAdd:
      result = a + b;
      break;

    case ExpressionOpType::kSub:
      result = a - b;
      break;

    case ExpressionOpType::kMul:
      result = a * b;
      break;

    case ExpressionOpType::kSll:
      result = (b > 63) ? uint64_t(0) : uint64_t(a << b);
      break;

    case ExpressionOpType::kSrl:
      result = (b > 63) ? uint64_t(0) : uint64_t(a >> b);
      break;

    case ExpressionOpType::kSra:
      result = Support::sar(a, Support::min<uint64_t>(b, 63));
      break;

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  *out = result;
  return kErrorOk;
}